

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<double>::Eigenvalue
          (TPZTensor<double> *this,TPZTensor<double> *eigenval,TPZTensor<double> *dSigma1,
          TPZTensor<double> *dSigma2,TPZTensor<double> *dSigma3)

{
  double dVar1;
  REAL RVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ostream *poVar6;
  double *pdVar7;
  TPZTensor<double> *source;
  TPZTensor<double> *this_00;
  TPZTensor<double> *source_00;
  TPZTensor<double> dLodeAngleTemp;
  TPZTensor<double> dI13;
  double OneOverTwoJ2;
  double tempCosPlusLode;
  double tempCosMinusLode;
  double tempCosLode;
  double I13;
  double TwoOverSqrThreeJ2;
  double TwoOverSqrThree;
  double pi23;
  double Lode;
  TPZTensor<double> dLode;
  TPZTensor<double> dJ3;
  TPZTensor<double> dJ2;
  double sqrtJ2;
  double J2;
  double I1;
  TPZTensor<double> *in_stack_fffffffffffffd30;
  TPZTensor<double> *this_01;
  TPZTensor<double> *in_stack_fffffffffffffd58;
  TPZTensor<double> *in_stack_fffffffffffffd60;
  TPZTensor<double> *in_stack_fffffffffffffe20;
  double local_160;
  TPZTensor<double> *in_stack_ffffffffffffff28;
  TPZTensor<double> *in_stack_ffffffffffffff30;
  TPZTensor<double> *in_stack_ffffffffffffff38;
  TPZTensor<double> *in_stack_ffffffffffffff40;
  double local_40;
  double local_38;
  
  dVar1 = TPZTensor<double>::I1(in_stack_fffffffffffffd30);
  local_38 = TPZTensor<double>::J2(in_stack_fffffffffffffe20);
  RVar2 = TPZExtractVal::val(local_38);
  if (ABS(RVar2) < 1e-06) {
    local_38 = 1e-06;
  }
  local_40 = sqrt(local_38);
  RVar2 = TPZExtractVal::val(local_40);
  if (ABS(RVar2) < 1e-06) {
    local_40 = 1e-06;
  }
  TPZTensor(in_stack_fffffffffffffd30);
  TPZTensor(in_stack_fffffffffffffd30);
  TPZTensor(in_stack_fffffffffffffd30);
  TPZTensor<double>::dJ2(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  TPZTensor<double>::dJ3(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Lodeangle(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(double *)in_stack_ffffffffffffff30)
  ;
  dVar3 = sqrt(3.0);
  local_40 = (2.0 / dVar3) * local_40;
  dVar1 = dVar1 / 3.0;
  dVar3 = cos(local_160);
  dVar4 = cos(local_160 - 2.0943951023931953);
  dVar5 = cos(local_160 + 2.0943951023931953);
  RVar2 = TPZExtractVal::val(local_160);
  if (RVar2 < 0.0) {
    poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_4c2748);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)dI13.fData.fExtAlloc[5],(size_t)dI13.fData.fExtAlloc[4]);
  }
  RVar2 = TPZExtractVal::val(local_160);
  if (1.0471975511965976 < RVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_4c2776);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)dI13.fData.fExtAlloc[5],(size_t)dI13.fData.fExtAlloc[4]);
  }
  pdVar7 = XX((TPZTensor<double> *)0x14a8742);
  *pdVar7 = dVar1 + dVar3 * local_40;
  pdVar7 = YY((TPZTensor<double> *)0x14a8781);
  *pdVar7 = dVar1 + dVar4 * local_40;
  this_01 = (TPZTensor<double> *)(dVar1 + dVar5 * local_40);
  pdVar7 = ZZ((TPZTensor<double> *)0x14a87c0);
  *pdVar7 = (double)this_01;
  source = (TPZTensor<double> *)XY((TPZTensor<double> *)0x14a87e3);
  (source->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)((double)(source->super_TPZSavable)._vptr_TPZSavable * 0.0);
  this_00 = (TPZTensor<double> *)XZ((TPZTensor<double> *)0x14a880b);
  (this_00->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)((double)(this_00->super_TPZSavable)._vptr_TPZSavable * 0.0);
  source_00 = (TPZTensor<double> *)YZ((TPZTensor<double> *)0x14a8833);
  (source_00->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)((double)(source_00->super_TPZSavable)._vptr_TPZSavable * 0.0);
  TPZTensor(this_01);
  Identity(this_00);
  operator*=(this_01,(double *)source);
  operator=(this_00,source_00);
  operator*=(this_01,(double *)source);
  operator+=(this_01,source);
  TPZTensor(this_01,source);
  sin(local_160);
  operator*=(this_01,(double *)source);
  operator-=(this_01,source);
  operator=(this_00,source_00);
  operator*=(this_01,(double *)source);
  operator+=(this_01,source);
  operator=(this_00,source_00);
  sin(2.0943951023931953 - local_160);
  operator*=(this_01,(double *)source);
  operator+=(this_01,source);
  operator=(this_00,source_00);
  operator*=(this_01,(double *)source);
  operator+=(this_01,source);
  operator=(this_00,source_00);
  sin(local_160 + 2.0943951023931953);
  operator*=(this_01,(double *)source);
  operator-=(this_01,source);
  ~TPZTensor((TPZTensor<double> *)0x14a8b39);
  ~TPZTensor((TPZTensor<double> *)0x14a8b46);
  ~TPZTensor((TPZTensor<double> *)0x14a8b53);
  ~TPZTensor((TPZTensor<double> *)0x14a8b60);
  ~TPZTensor((TPZTensor<double> *)0x14a8b6d);
  return;
}

Assistant:

void TPZTensor<T>::Eigenvalue(TPZTensor<T> &eigenval, TPZTensor<T> &dSigma1, TPZTensor<T> &dSigma2, TPZTensor<T> &dSigma3)const {
    T I1(this->I1()), J2(this->J2());
    //	T J3(this->J3());

    if (fabs(TPZExtractVal::val(J2)) < 1.e-6)J2 = 1.e-6;
    //	if(fabs( TPZExtractVal::val(J2) ) < 1.e-6)return;

    T sqrtJ2 = sqrt(J2);
    if (fabs(TPZExtractVal::val(sqrtJ2)) < 1.e-6)sqrtJ2 = 1.e-6;

    TPZTensor<T> dJ2, dJ3, dLode;
    T Lode;

    this->dJ2(dJ2);
    this->dJ3(dJ3);
    this->Lodeangle(dLode, Lode);

    T pi23 = T(2. * M_PI / 3.);
    T TwoOverSqrThree = T(2. / sqrt(3.));
    T TwoOverSqrThreeJ2 = TwoOverSqrThree * sqrtJ2;
    T I13 = I1 / T(3.);

    T tempCosLode = cos(Lode) * TwoOverSqrThreeJ2;
    T tempCosMinusLode = cos(Lode - pi23) * TwoOverSqrThreeJ2;
    T tempCosPlusLode = cos(Lode + pi23) * TwoOverSqrThreeJ2;

    if (TPZExtractVal::val(Lode) < 0.) {
        std::cout << "Lode angle é Menor que ZERO. Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3 " << std::endl;
        DebugStop();
    }
    if (TPZExtractVal::val(Lode) > M_PI / 3.) {
        std::cout << "Lode angle é Maior que Pi/3. Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3 " << std::endl;
        DebugStop();
    }

    /*ORIGINAL*/
    //Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3

    eigenval.XX() = I13 + tempCosLode;
    eigenval.YY() = I13 + tempCosMinusLode;
    eigenval.ZZ() = I13 + tempCosPlusLode;
    eigenval.XY() *= T(0.);
    eigenval.XZ() *= T(0.);
    eigenval.YZ() *= T(0.);




#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "\n  TPZTENSOR";
        sout << "\n  LodeAngle = \n" << Lode;
        sout << "\n  dLodeAngle= " << dLode;
        sout << "\n";
        LOGPZ_INFO(loggerr, sout.str());
    }
#endif



    T OneOverTwoJ2 = T(0.5) / J2;
    TPZTensor<T> dI13;
    dI13.Identity();
    dI13 *= T(1. / 3.);

    tempCosLode *= OneOverTwoJ2;
    tempCosMinusLode *= OneOverTwoJ2;
    tempCosPlusLode *= OneOverTwoJ2;

    dSigma1 = dJ2;
    dSigma1 *= tempCosLode;
    dSigma1 += dI13;
    TPZTensor<T> dLodeAngleTemp(dLode);
    dLodeAngleTemp *= sin(Lode) * TwoOverSqrThreeJ2;
    dSigma1 -= dLodeAngleTemp;

    dSigma2 = dJ2;
    dSigma2 *= tempCosMinusLode;
    dSigma2 += dI13;
    dLodeAngleTemp = dLode;
    dLodeAngleTemp *= sin(pi23 - Lode) * TwoOverSqrThreeJ2;
    dSigma2 += dLodeAngleTemp;

    dSigma3 = dJ2;
    dSigma3 *= tempCosPlusLode;
    dSigma3 += dI13;
    dLodeAngleTemp = dLode;
    dLodeAngleTemp *= sin(pi23 + Lode) * TwoOverSqrThreeJ2;
    dSigma3 -= dLodeAngleTemp;
}